

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_memory.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBMemoryInit(ClientContext *context,TableFunctionInitInput *input)

{
  BufferManager *pBVar1;
  pointer pDVar2;
  _Head_base<0UL,_duckdb::DuckDBMemoryData_*,_false> local_30;
  _Vector_base<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_> local_28;
  
  make_uniq<duckdb::DuckDBMemoryData>();
  pBVar1 = BufferManager::GetBufferManager((ClientContext *)input);
  (*pBVar1->_vptr_BufferManager[0x17])(&local_28,pBVar1);
  pDVar2 = unique_ptr<duckdb::DuckDBMemoryData,_std::default_delete<duckdb::DuckDBMemoryData>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBMemoryData,_std::default_delete<duckdb::DuckDBMemoryData>,_true>
                         *)&local_30);
  ::std::vector<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>::
  _M_move_assign(&(pDVar2->entries).
                  super_vector<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>
                 ,&local_28);
  ::std::_Vector_base<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>::
  ~_Vector_base(&local_28);
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_30._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBMemoryInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBMemoryData>();
	result->entries = BufferManager::GetBufferManager(context).GetMemoryUsageInfo();
	return std::move(result);
}